

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O2

void kratos::generate_verilog_pkg(Generator *top,SystemVerilogCodeGenOptions *options)

{
  string *__lhs;
  size_t *__return_storage_ptr__;
  Generator *generator;
  __type _Var1;
  bool bVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  UserException *this;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  basic_string_view<char> bVar5;
  string_view format_str;
  format_args args;
  SystemVerilogCodeGenOptions local_5f8;
  undefined1 local_5a0 [8];
  ofstream out;
  streambuf local_590 [632];
  undefined1 auStack_318 [8];
  set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
  gens;
  undefined1 local_190 [8];
  __string_type content_1;
  UniqueGeneratorVisitor unique_visitor;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  result;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  values;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> def_str;
  string header_filename;
  
  __lhs = &options->package_name;
  _Var1 = std::operator==(__lhs,&top->name);
  if (_Var1) {
    this = (UserException *)__cxa_allocate_exception(0x10);
    auStack_318 = (undefined1  [8])(top->name)._M_dataplus._M_p;
    gens._M_t._M_impl._0_8_ = (top->name)._M_string_length;
    bVar5 = fmt::v7::to_string_view<char,_0>("Package name cannot be the same as module name ({0}");
    format_str.data_ = (char *)bVar5.size_;
    format_str.size_ = 0xd;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.args_ = in_R9.args_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)auStack_318;
    fmt::v7::detail::vformat_abi_cxx11_((string *)local_5a0,(detail *)bVar5.data_,format_str,args);
    UserException::UserException(this,(string *)local_5a0);
    __cxa_throw(this,&UserException::typeinfo,std::runtime_error::~runtime_error);
  }
  unique_visitor.super_IRVisitor._8_8_ =
       &unique_visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize;
  unique_visitor.super_IRVisitor._vptr_IRVisitor._0_4_ = 0;
  unique_visitor.super_IRVisitor.visited_._M_h._M_buckets = (__buckets_ptr)0x1;
  unique_visitor.super_IRVisitor.visited_._M_h._M_bucket_count = 0;
  unique_visitor.super_IRVisitor.visited_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  unique_visitor.super_IRVisitor.visited_._M_h._M_element_count._0_4_ = 0x3f800000;
  unique_visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  unique_visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._4_4_ = 0;
  unique_visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize = 0;
  content_1.field_2._8_8_ = &PTR_visit_root_002b2000;
  unique_visitor.generator_map_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&unique_visitor.generator_map_;
  unique_visitor.generator_map_._M_t._M_impl._0_4_ = 0;
  unique_visitor.generator_map_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  unique_visitor.generator_map_._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  unique_visitor.generator_map_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)0x0;
  unique_visitor.generator_map_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       unique_visitor.generator_map_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  IRVisitor::visit_generator_root_p((IRVisitor *)((long)&content_1.field_2 + 8),top);
  track_generators(top);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&def_str.field_2 + 8),__lhs,".svh");
  result._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&result;
  result._M_t._M_impl._0_4_ = 0;
  result._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  result._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  result._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  result._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       result._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  for (p_Var3 = unique_visitor.generator_map_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
      ; p_Var3 != (_Base_ptr)&unique_visitor.generator_map_;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    generator = *(Generator **)(p_Var3 + 2);
    SystemVerilogCodeGenOptions::SystemVerilogCodeGenOptions(&local_5f8,options);
    SystemVerilogCodeGen::SystemVerilogCodeGen
              ((SystemVerilogCodeGen *)local_5a0,generator,&local_5f8);
    SystemVerilogCodeGenOptions::~SystemVerilogCodeGenOptions(&local_5f8);
    SystemVerilogCodeGen::str_abi_cxx11_((string *)auStack_318,(SystemVerilogCodeGen *)local_5a0);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_unique<std::__cxx11::string_const&,std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&unique_visitor.generator_map_._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var3 + 1),
               (string *)auStack_318);
    std::__cxx11::string::~string((string *)auStack_318);
    SystemVerilogCodeGen::~SystemVerilogCodeGen((SystemVerilogCodeGen *)local_5a0);
  }
  __return_storage_ptr__ = &result._M_t._M_impl.super__Rb_tree_header._M_node_count;
  for (p_Var3 = result._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var3 != (_Rb_tree_node_base *)&result; p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3))
  {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var3 + 1)
                   ,".sv");
    fs::join((string *)__return_storage_ptr__,&options->output_dir,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5a0);
    std::__cxx11::string::~string((string *)local_5a0);
    bVar2 = fs::exists((string *)__return_storage_ptr__);
    if (bVar2) {
      std::ifstream::ifstream
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5a0,
                 (string *)__return_storage_ptr__,_S_in);
      std::__cxx11::stringstream::stringstream((stringstream *)auStack_318);
      std::ostream::operator<<(&gens._M_t._M_impl.super__Rb_tree_header,local_590);
      std::__cxx11::stringbuf::str();
      _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &values.second,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (p_Var3 + 2));
      std::__cxx11::string::~string((string *)&values.second);
      std::__cxx11::stringstream::~stringstream((stringstream *)auStack_318);
      std::ifstream::~ifstream
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5a0);
      if (!_Var1) goto LAB_001987b8;
    }
    else {
LAB_001987b8:
      std::ofstream::ofstream
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5a0,
                 (string *)__return_storage_ptr__,_S_trunc);
      std::operator<<((ostream *)local_5a0,(string *)(p_Var3 + 2));
      Context::get_generators_by_name
                ((set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                  *)auStack_318,top->context_,(string *)(p_Var3 + 1));
      for (p_Var4 = gens._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var4 != (_Rb_tree_node_base *)&gens; p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)
          ) {
        if (*(char *)(*(long *)(p_Var4 + 1) + 0xbc) == '\x01') {
          std::__cxx11::string::_M_assign((string *)(*(long *)(p_Var4 + 1) + 0xc0));
        }
      }
      std::
      _Rb_tree<std::shared_ptr<kratos::Generator>,_std::shared_ptr<kratos::Generator>,_std::_Identity<std::shared_ptr<kratos::Generator>_>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
      ::~_Rb_tree((_Rb_tree<std::shared_ptr<kratos::Generator>,_std::shared_ptr<kratos::Generator>,_std::_Identity<std::shared_ptr<kratos::Generator>_>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                   *)auStack_318);
      std::ofstream::~ofstream
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5a0);
    }
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  if (options->extract_debug_info != false) {
    output_pkg_debug_info
              ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>_>_>
                *)&unique_visitor.super_IRVisitor.visited_._M_h._M_single_bucket,options);
  }
  fs::join((string *)local_5a0,&options->output_dir,(string *)((long)&def_str.field_2 + 8));
  std::__cxx11::string::operator=((string *)(def_str.field_2._M_local_buf + 8),(string *)local_5a0);
  std::__cxx11::string::~string((string *)local_5a0);
  generate_sv_package_header
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              *)&result._M_t._M_impl.super__Rb_tree_header._M_node_count,top,__lhs,true);
  std::__cxx11::string::string
            ((string *)&values.second,
             (string *)&result._M_t._M_impl.super__Rb_tree_header._M_node_count);
  bVar2 = fs::exists((string *)((long)&def_str.field_2 + 8));
  if (bVar2) {
    std::ifstream::ifstream(local_5a0,(string *)(def_str.field_2._M_local_buf + 8),_S_in);
    std::__cxx11::stringstream::stringstream((stringstream *)auStack_318);
    std::ostream::operator<<(&gens._M_t._M_impl.super__Rb_tree_header,local_590);
    std::__cxx11::stringbuf::str();
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_190,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &values.second);
    std::__cxx11::string::~string((string *)local_190);
    std::__cxx11::stringstream::~stringstream((stringstream *)auStack_318);
    std::ifstream::~ifstream(local_5a0);
    if (_Var1) goto LAB_0019898c;
  }
  std::ofstream::ofstream
            (local_5a0,(string *)(def_str.field_2._M_local_buf + 8),_S_trunc|_S_out|_S_in);
  std::operator<<((ostream *)local_5a0,(string *)&values.second);
  std::ofstream::~ofstream(local_5a0);
LAB_0019898c:
  std::__cxx11::string::~string((string *)&values.second);
  std::__cxx11::string::~string((string *)&result._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&unique_visitor.generator_map_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string((string *)(def_str.field_2._M_local_buf + 8));
  UniqueGeneratorVisitor::~UniqueGeneratorVisitor
            ((UniqueGeneratorVisitor *)((long)&content_1.field_2 + 8));
  return;
}

Assistant:

void generate_verilog_pkg(Generator* top, SystemVerilogCodeGenOptions options) {
    // input check
    if (options.package_name == top->name) {
        throw UserException(
            ::format("Package name cannot be the same as module name ({0}", top->name));
    }
    // this pass assumes that all the generators has been uniquified
    // first get all the unique generators
    UniqueGeneratorVisitor unique_visitor;
    // this can be parallelized
    unique_visitor.visit_generator_root_p(top);
    auto const& generator_map = unique_visitor.generator_map();
    track_generators(top);

    // we use header_name + ".svh"
    std::string header_filename = options.package_name + ".svh";
    std::map<std::string, std::string> result;
    for (const auto& [module_name, module_gen] : generator_map) {
        SystemVerilogCodeGen codegen(module_gen, options);
        result.emplace(module_name, codegen.str());
    }
    // write out the content to the output_dir
    // we assume output_dir already exists
    // notice that if the content is the same, we don't override to avoid modifying the timestamps
    // this will help with incremental compile in the downstream tools, typically the commercial
    // ones
    // unfortunately verilator doesn't support incremental build. see
    // https://www.veripool.org/boards/2/topics/2822
    for (auto const& [module_name, src] : result) {
        auto path = kratos::fs::join(options.output_dir, module_name + ".sv");
        if (kratos::fs::exists(path)) {
            // load up the file
            std::ifstream in(path);
            std::stringstream content_stream;
            content_stream << in.rdbuf();
            std::string content = content_stream.str();
            if (content == src) continue;
        }
        // truncate mode
        std::ofstream out(path, std::ios::trunc);
        out << src;
        // tell the system where it went, if allowed
        auto gens = top->context()->get_generators_by_name(module_name);
        for (auto const& gen : gens) {
            if (gen->debug) gen->verilog_fn = path;
        }
    }
    // output debug info as well, if required
    if (options.extract_debug_info) {
        output_pkg_debug_info(generator_map, options);
    }

    header_filename = kratos::fs::join(options.output_dir, header_filename);

    // compare it with the old one, if exists. this is for incremental build
    auto values = generate_sv_package_header(top, options.package_name, true);
    auto def_str = values.first;
    if (kratos::fs::exists(header_filename)) {
        std::ifstream in(header_filename);
        std::stringstream content_stream;
        content_stream << in.rdbuf();
        auto content = content_stream.str();
        if (content == def_str) {
            return;
        }
    }
    std::ofstream out(header_filename, std::ios::in | std::ios::out | std::ios::trunc);
    out << def_str;
}